

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_graph.cpp
# Opt level: O0

Read<long> __thiscall
Omega_h::map_onto<long>(Omega_h *this,Read<long> *a_data,Graph *a2b,LO nb,long init_val,Int width)

{
  void *extraout_RDX;
  Read<long> RVar1;
  Write<long> local_d0;
  Write<long> local_c0;
  Graph local_b0;
  Read<long> local_90 [2];
  allocator local_69;
  string local_68 [32];
  undefined1 local_48 [8];
  Write<long> out;
  Int width_local;
  long init_val_local;
  LO nb_local;
  Graph *a2b_local;
  Read<long> *a_data_local;
  
  out.shared_alloc_.direct_ptr._4_4_ = width;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_68,"",&local_69);
  Write<long>::Write((Write<long> *)local_48,nb * width,init_val,(string *)local_68);
  std::__cxx11::string::~string(local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  Read<long>::Read(local_90,(Read<int> *)a_data);
  Graph::Graph(&local_b0,a2b);
  Write<long>::Write(&local_c0,(Write<int> *)local_48);
  map_into<long>(local_90,&local_b0,&local_c0,out.shared_alloc_.direct_ptr._4_4_);
  Write<long>::~Write(&local_c0);
  Graph::~Graph(&local_b0);
  Read<long>::~Read(local_90);
  Write<long>::Write(&local_d0,(Write<int> *)local_48);
  Read<long>::Read((Read<long> *)this,&local_d0);
  Write<long>::~Write(&local_d0);
  Write<long>::~Write((Write<long> *)local_48);
  RVar1.write_.shared_alloc_.direct_ptr = extraout_RDX;
  RVar1.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Read<long>)RVar1.write_.shared_alloc_;
}

Assistant:

Read<T> map_onto(Read<T> a_data, Graph a2b, LO nb, T init_val, Int width) {
  auto out = Write<T>(nb * width, init_val);
  map_into(a_data, a2b, out, width);
  return out;
}